

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void steal_monster_item(monster *mon,wchar_t midx)

{
  byte bVar1;
  loc_conflict grid;
  _Bool _Var2;
  int16_t iVar3;
  uint32_t uVar4;
  wchar_t wVar5;
  monster_lore_conflict *pmVar6;
  monster_conflict *mon_00;
  int iVar7;
  source sVar8;
  source origin;
  source origin_00;
  wchar_t local_1d0;
  char local_1c8 [8];
  char t_name [80];
  char *near;
  char local_148 [8];
  char o_name_1 [80];
  char o_name [80];
  wchar_t wake;
  wchar_t monster_reaction;
  wchar_t steal_skill;
  wchar_t guard;
  _Bool unique;
  char m_name [80];
  monster *thief;
  monster_lore *lore;
  object *obj;
  monster *pmStack_10;
  wchar_t midx_local;
  monster *mon_local;
  
  obj._4_4_ = midx;
  pmStack_10 = mon;
  lore = (monster_lore *)get_random_monster_object(mon);
  pmVar6 = get_lore(pmStack_10->race);
  monster_desc((char *)&guard,0x50,pmStack_10,L'\x15');
  if (obj._4_4_ < L'\0') {
    _Var2 = monster_is_unique(pmStack_10);
    iVar7 = 3;
    if (_Var2) {
      iVar7 = 4;
    }
    monster_reaction =
         ((pmStack_10->race->level * iVar7) / 4 + (uint)pmStack_10->mspeed) - (player->state).speed;
    wake = (player->state).skills[5] + adj_dex_th[(player->state).stat_ind[3]];
    if (lore == (monster_lore *)0x0) {
      msg("You can find nothing to steal from %s.");
      uVar4 = Rand_div(3);
      if (uVar4 == 0) {
        monster_wake(pmStack_10,false,L'd');
      }
    }
    else {
      if (((player->timed[2] != 0) || (player->timed[4] != 0)) || (player->timed[6] != 0)) {
        wake = wake / 4;
      }
      if (pmStack_10->m_timed[0] != 0) {
        monster_reaction = monster_reaction / 2;
      }
      if (monster_reaction < L'\x01') {
        local_1d0 = L'\x01';
      }
      else {
        local_1d0 = monster_reaction;
      }
      uVar4 = Rand_div(local_1d0);
      bVar1 = lore[2].field_0x3a;
      iVar3 = object_weight_one((object *)lore);
      wVar5 = (int)((uint)bVar1 * (int)iVar3) / 0x14 + monster_reaction / 2 + uVar4 + 1;
      if (wVar5 < wake) {
        wVar5 = (player->state).skills[5];
        *(undefined2 *)&lore[2].field_0x3c = 0;
        pile_excise(&pmStack_10->held_obj,(object *)lore);
        _Var2 = tval_is_money((object *)lore);
        if (_Var2) {
          msg("You steal %d gold pieces worth of treasure.",
              (ulong)(uint)(int)*(short *)&lore->field_0x3e);
          player->au = (int)*(short *)&lore->field_0x3e + player->au;
          player->upkeep->redraw = player->upkeep->redraw | 0x100;
          delist_object(cave,(object *)lore);
          object_delete((chunk *)cave,(chunk *)player->cave,(object **)&lore);
        }
        else {
          object_grab(player,(object *)lore);
          delist_object((chunk_conflict *)player->cave,*(object **)(lore->flags + 8));
          delist_object(cave,(object *)lore);
          _Var2 = ignore_item_ok(player,(object *)lore);
          if ((_Var2) || (_Var2 = inven_carry_okay((object *)lore), !_Var2)) {
            object_desc(o_name_1 + 0x48,0x50,(object *)lore,0x43,player);
            grid.x = (player->grid).x;
            grid.y = (player->grid).y;
            drop_near((chunk *)cave,(object **)&lore,L'\0',grid,true,true);
            msg("You drop %s.");
          }
          else {
            inven_carry(player,(object *)lore,true,true);
          }
        }
        pmVar6->thefts = pmVar6->thefts + 1;
        mon_dec_timed(pmStack_10,L'\0',L'#' - wVar5,L'\x01');
      }
      else if (wVar5 / 2 < wake) {
        object_see(player,(object *)lore);
        _Var2 = tval_is_money((object *)lore);
        if (_Var2) {
          strnfmt(local_148,0x50,"treasure");
        }
        else {
          object_desc(local_148,0x50,(object *)lore,0x43,player);
        }
        msg("You fail to steal %s from %s.",local_148,&guard);
        monster_wake(pmStack_10,true,L'2');
      }
      else {
        monster_wake(pmStack_10,true,L'd');
        monster_desc((char *)&guard,0x50,pmStack_10,L'̔');
        msg("%s cries out in anger!",&guard);
        sVar8 = source_monster(pmStack_10->midx);
        origin.which = sVar8.which;
        origin._4_4_ = 0;
        origin.what = sVar8.what;
        effect_simple(L'6',origin,"",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
        (pmStack_10->target).midx = L'\xffffffff';
      }
      if (player->timed[0x2d] != 0) {
        msg("You vanish into the shadows!");
        sVar8 = source_player();
        origin_00.which = sVar8.which;
        origin_00._4_4_ = 0;
        origin_00.what = sVar8.what;
        effect_simple(L';',origin_00,"20",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
        player_clear_timed(player,L'-',false,false);
      }
    }
  }
  else {
    mon_00 = cave_monster(cave,obj._4_4_);
    if (mon_00 == (monster_conflict *)0x0) {
      __assert_fail("thief",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                    ,0x648,"void steal_monster_item(struct monster *, int)");
    }
    monster_desc(local_1c8,0x50,(monster *)mon_00,L'̔');
    if ((lore == (monster_lore *)0x0) ||
       (_Var2 = react_to_slay((object *)lore,(monster *)mon_00), _Var2)) {
      msg("%s tries to steal something from %s, but fails.",local_1c8,&guard);
    }
    else {
      msg("%s steals something from %s!",local_1c8,&guard);
      *(undefined2 *)&lore[2].field_0x3c = 0;
      pile_excise(&pmStack_10->held_obj,(object *)lore);
      monster_carry((chunk *)cave,(monster *)mon_00,(object *)lore);
      (pmStack_10->target).midx = mon_00->midx;
    }
  }
  return;
}

Assistant:

void steal_monster_item(struct monster *mon, int midx)
{
	struct object *obj = get_random_monster_object(mon);
	struct monster_lore *lore = get_lore(mon->race);
	struct monster *thief = NULL;
	char m_name[80];

	/* Get the target monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);

	if (midx < 0) {
		/* Base monster protection and player stealing skill */
		bool unique = monster_is_unique(mon);
		int guard = (mon->race->level * (unique ? 4 : 3)) / 4 +
			mon->mspeed - player->state.speed;
		int steal_skill = player->state.skills[SKILL_STEALTH] +
			adj_dex_th[player->state.stat_ind[STAT_DEX]];
		int monster_reaction;

		/* No object */
		if (!obj) {
			msg("You can find nothing to steal from %s.", m_name);
			if (one_in_(3)) {
				/* Monster notices */
				monster_wake(mon, false, 100);
			}
			return;
		}

		/* Penalize some status conditions */
		if (player->timed[TMD_BLIND] || player->timed[TMD_CONFUSED] ||
			player->timed[TMD_IMAGE]) {
			steal_skill /= 4;
		}
		if (mon->m_timed[MON_TMD_SLEEP]) {
			guard /= 2;
		}

		/* Monster base reaction, plus allowance for item weight */
		monster_reaction = guard / 2 + randint1(MAX(guard, 1));
		monster_reaction += (obj->number * object_weight_one(obj)) / 20;

		/* Try and steal */
		if (monster_reaction < steal_skill) {
			int wake = 35 - player->state.skills[SKILL_STEALTH];

			/* Success! */
			obj->held_m_idx = 0;
			pile_excise(&mon->held_obj, obj);
			if (tval_is_money(obj)) {
				msg("You steal %d gold pieces worth of treasure.", obj->pval);
				player->au += obj->pval;
				player->upkeep->redraw |= (PR_GOLD);
				delist_object(cave, obj);
				object_delete(cave, player->cave, &obj);
			} else {
				object_grab(player, obj);
				delist_object(player->cave, obj->known);
				delist_object(cave, obj);
				/* Drop immediately if ignored,
				   or if inventory already full to prevent pack overflow */
				if (ignore_item_ok(player, obj) || !inven_carry_okay(obj)) {
					char o_name[80];
					object_desc(o_name, sizeof(o_name), obj,
						ODESC_PREFIX | ODESC_FULL,
						player);
					drop_near(cave, &obj, 0, player->grid, true, true);
					msg("You drop %s.", o_name);
				} else {
					inven_carry(player, obj, true, true);
				}
			}

			/* Track thefts */
			lore->thefts++;

			/* Monster wakes a little */
			mon_dec_timed(mon, MON_TMD_SLEEP, wake, MON_TMD_FLG_NOTIFY);
		} else if (monster_reaction / 2 < steal_skill) {
			/* Decent attempt, at least */
			char o_name[80];

			object_see(player, obj);
			if (tval_is_money(obj)) {
				(void)strnfmt(o_name, sizeof(o_name), "treasure");
			} else {
				object_desc(o_name, sizeof(o_name), obj,
					ODESC_PREFIX | ODESC_FULL, player);
			}
			msg("You fail to steal %s from %s.", o_name, m_name);
			/* Monster wakes, may notice */
			monster_wake(mon, true, 50);
		} else {
			/* Bungled it */
			monster_wake(mon, true, 100);
			monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
			msg("%s cries out in anger!", m_name);
			effect_simple(EF_WAKE, source_monster(mon->midx), "", 0, 0, 0, 0, 0,
						  NULL);

			/* Become hostile */
			mon->target.midx = -1;
		}

		/* Player hit and run */
		if (player->timed[TMD_ATT_RUN]) {
			const char *near = "20";
			msg("You vanish into the shadows!");
			effect_simple(EF_TELEPORT, source_player(), near, 0, 0, 0, 0, 0,
						  NULL);
			(void) player_clear_timed(player, TMD_ATT_RUN, false,
				false);
		}
	} else {
		/* Get the thief details */
		char t_name[80];
		thief = cave_monster(cave, midx);
		assert(thief);
		monster_desc(t_name, sizeof(t_name), thief, MDESC_STANDARD);

		/* Try to steal */
		if (!obj || react_to_slay(obj, thief)) {
			/* Fail to steal */
			msg("%s tries to steal something from %s, but fails.", t_name,
				m_name);
		} else {
			msg("%s steals something from %s!", t_name, m_name);

			/* Steal and carry */
			obj->held_m_idx = 0;
			pile_excise(&mon->held_obj, obj);
			(void)monster_carry(cave, thief, obj);

			/* Become hostile */
			mon->target.midx = thief->midx;
		}
	}
}